

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O3

void bandit::use_default_formatters(choice_options *choices)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_78;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"vs","");
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:55:34)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:55:34)>
             ::_M_manager;
  detail::option_map::add(&choices->formatters,&local_78,(controller_func_t *)&local_38,false);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"posix","");
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:58:37)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:58:37)>
             ::_M_manager;
  detail::option_map::add(&choices->formatters,&local_78,(controller_func_t *)&local_58,true);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void use_default_formatters(detail::choice_options& choices) {
    choices.formatters.add("vs", [&](detail::controller_t& controller) {
      controller.set_formatter(new failure_formatter::visual_studio());
    });
    choices.formatters.add("posix", [&](detail::controller_t& controller) {
      controller.set_formatter(new failure_formatter::posix());
    }, true);
  }